

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O3

void es5503_pcm_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  ushort *puVar1;
  size_t __n;
  byte bVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int resshift;
  long lVar10;
  byte bVar11;
  ulong uVar12;
  UINT32 acc;
  uint local_74;
  UINT32 local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  long local_58;
  ES5503Chip *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_38 = (ulong)samples;
  __n = local_38 * 4;
  uVar8 = 0;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  bVar4 = *(byte *)((long)param + 0x338);
  if (bVar4 != 0) {
    bVar2 = *(byte *)((long)param + 0x340);
    bVar11 = bVar2 & 0xfe;
    lVar10 = (long)param + 0x38;
    local_70 = samples;
    local_58 = lVar10;
    local_50 = (ES5503Chip *)param;
    do {
      bVar5 = *(byte *)(lVar10 + 4 + uVar8 * 0x18);
      if (((bVar5 & 1) == 0) &&
         (puVar1 = (ushort *)(lVar10 + uVar8 * 0x18), *(char *)((long)puVar1 + 0x15) == '\0')) {
        uVar7 = (ulong)((uint)(byte)puVar1[6] * 4);
        local_5c = *(uint *)((long)wavemasks + uVar7) & *(uint *)(puVar1 + 4);
        local_74 = *(uint *)(puVar1 + 8);
        if (samples != 0) {
          resshift = resshifts[*(byte *)((long)puVar1 + 0xd)] - (uint)(byte)puVar1[6];
          bVar4 = ((ES5503Chip *)param)->outchn_mask & bVar5 >> 4;
          local_60 = *(uint *)((long)accmasks + uVar7);
          local_68 = (uint)*(byte *)((long)puVar1 + 5);
          local_64 = (uint)*puVar1;
          local_6c = puVar1[1] - 1 & 0xffff;
          uVar7 = (ulong)(bVar4 & 1);
          uVar12 = 0;
          local_48 = uVar7;
          local_40 = uVar8;
          do {
            uVar9 = local_74 >> ((byte)resshift & 0x1f);
            local_74 = local_74 + local_64;
            ((ES5503Chip *)param)->channel_strobe = bVar5 >> 4;
            bVar5 = ((ES5503Chip *)param)->docram[(uVar9 & local_60) + local_5c];
            *(byte *)(puVar1 + 3) = bVar5;
            if (bVar5 == 0) {
              iVar3 = 1;
LAB_00170e8a:
              es5503_halt_osc((ES5503Chip *)param,(int)uVar8,iVar3,&local_74,resshift);
              uVar8 = local_40;
              param = local_50;
              uVar7 = local_48;
            }
            else {
              iVar3 = (bVar5 - 0x80) * local_68;
              if (bVar11 != 0) {
                bVar5 = 0;
                do {
                  if (bVar4 == bVar5) {
                    outputs[uVar7][uVar12] = outputs[uVar7][uVar12] + iVar3;
                  }
                  bVar5 = bVar5 + 1;
                } while (bVar11 != bVar5);
              }
              bVar5 = ((ES5503Chip *)param)->output_channels;
              if (bVar11 < bVar5) {
                iVar3 = iVar3 * 0xb5 >> 8;
                bVar6 = bVar2 & 0xfe;
                do {
                  if (bVar4 == bVar6) {
                    (*outputs)[uVar12] = (*outputs)[uVar12] + iVar3;
                    outputs[1][uVar12] = outputs[1][uVar12] + iVar3;
                  }
                  bVar6 = bVar6 + 1;
                } while (bVar6 < bVar5);
              }
              iVar3 = 0;
              if (local_6c <= uVar9) goto LAB_00170e8a;
            }
            bVar5 = (byte)puVar1[2];
          } while (((bVar5 & 1) == 0) && (uVar12 = uVar12 + 1, uVar12 < local_38));
          bVar4 = ((ES5503Chip *)param)->oscsenabled;
          lVar10 = local_58;
          samples = local_70;
        }
        *(uint *)(puVar1 + 8) = local_74;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < bVar4);
  }
  return;
}

Assistant:

static void es5503_pcm_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	UINT8 osc;
	UINT32 snum;
	UINT32 ramptr;
	ES5503Chip *chip = (ES5503Chip *)param;
	UINT8 chnsStereo, chan;

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));

	chnsStereo = chip->output_channels & ~1;
	for (osc = 0; osc < chip->oscsenabled; osc++)
	{
		ES5503Osc *pOsc = &chip->oscillators[osc];

		if (!(pOsc->control & 1) && ! pOsc->Muted)
		{
			UINT32 wtptr = pOsc->wavetblpointer & wavemasks[pOsc->wavetblsize];
			UINT32 altram;
			UINT32 acc = pOsc->accumulator;
			UINT16 wtsize = pOsc->wtsize - 1;
			UINT16 freq = pOsc->freq;
			INT16 vol = pOsc->vol;
			UINT8 chnMask = (pOsc->control >> 4) & 0x0F;
			int resshift = resshifts[pOsc->resolution] - pOsc->wavetblsize;
			UINT32 sizemask = accmasks[pOsc->wavetblsize];
			INT32 outData;

			chnMask &= chip->outchn_mask;
			for (snum = 0; snum < samples; snum++)
			{
				altram = acc >> resshift;
				ramptr = altram & sizemask;

				acc += freq;

				// channel strobe is always valid when reading; this allows potentially banking per voice
				chip->channel_strobe = (pOsc->control>>4) & 0xf;
				pOsc->data = chip->docram[ramptr + wtptr];

				if (pOsc->data == 0x00)
				{
					es5503_halt_osc(chip, osc, 1, &acc, resshift);
				}
				else
				{
					outData = (pOsc->data - 0x80) * vol;
					
					// send groups of 2 channels to L or R
					for (chan = 0; chan < chnsStereo; chan ++)
					{
						if (chan == chnMask)
							outputs[chan & 1][snum] += outData;
					}
					outData = (outData * 181) >> 8;	// outData *= sqrt(2)
					// send remaining channels to L+R
					for (; chan < chip->output_channels; chan ++)
					{
						if (chan == chnMask)
						{
							outputs[0][snum] += outData;
							outputs[1][snum] += outData;
						}
					}

					if (altram >= wtsize)
					{
						es5503_halt_osc(chip, osc, 0, &acc, resshift);
					}
				}

				// if oscillator halted, we've got no more samples to generate
				if (pOsc->control & 1)
				{
					pOsc->control |= 1;
					break;
				}
			}

			pOsc->accumulator = acc;
		}
	}
}